

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interprocedural.cpp
# Opt level: O0

void __thiscall
dg::pta::LLVMPointerGraphBuilder::addInterproceduralOperands
          (LLVMPointerGraphBuilder *this,Function *F,PointerSubgraph *subg,CallInst *CI,
          PSNode *callNode)

{
  bool bVar1;
  PSNodeCallRet *this_00;
  size_t sVar2;
  CallInst *in_RCX;
  PSNode *in_RDX;
  PSNode *in_RSI;
  Function *in_RDI;
  PSNode *in_R8;
  LLVMPointerGraphBuilder *unaff_retaddr;
  PSNodeCallRet *callReturnNode;
  
  addArgumentsOperands
            ((LLVMPointerGraphBuilder *)subg,(Function *)CI,(CallInst *)callNode,
             callReturnNode._4_4_);
  bVar1 = llvm::Function::isVarArg((Function *)0x1b21d1);
  if (bVar1) {
    if (in_RCX == (CallInst *)0x0) {
      addVariadicArgumentOperands(unaff_retaddr,in_RDI,in_RSI);
    }
    else {
      addVariadicArgumentOperands((LLVMPointerGraphBuilder *)in_RSI,(Function *)in_RDX,in_RCX,in_R8)
      ;
    }
  }
  bVar1 = std::
          set<dg::pta::PSNode_*,_std::less<dg::pta::PSNode_*>,_std::allocator<dg::pta::PSNode_*>_>::
          empty((set<dg::pta::PSNode_*,_std::less<dg::pta::PSNode_*>,_std::allocator<dg::pta::PSNode_*>_>
                 *)0x1b222a);
  if (bVar1) {
    if (in_R8 != (PSNode *)0x0) {
      PSNode::getPairedNode(in_R8);
      this_00 = PSNodeCallRet::cast((PSNode *)0x1b2262);
      sVar2 = SubgraphNode<dg::pta::PSNode>::successorsNum
                        ((SubgraphNode<dg::pta::PSNode> *)0x1b2275);
      if (sVar2 != 0) {
        SubgraphNode<dg::pta::PSNode>::removeSingleSuccessor
                  ((SubgraphNode<dg::pta::PSNode> *)this_00);
      }
    }
  }
  else {
    addReturnNodesOperands(unaff_retaddr,in_RDI,(PointerSubgraph *)in_RSI,in_RDX);
  }
  return;
}

Assistant:

void LLVMPointerGraphBuilder::addInterproceduralOperands(
        const llvm::Function *F, PointerSubgraph &subg,
        const llvm::CallInst *CI, PSNode *callNode) {
    assert((!CI || callNode) && (!callNode || CI));

    // add operands to arguments' PHI nodes
    addArgumentsOperands(F, CI);

    if (F->isVarArg()) {
        assert(subg.vararg);
        if (CI)
            // funcptr call
            addVariadicArgumentOperands(F, CI, subg.vararg);
        else
            addVariadicArgumentOperands(F, subg.vararg);
    }

    if (!subg.returnNodes.empty()) {
        addReturnNodesOperands(F, subg, callNode);
    } else if (callNode) {
        // disconnect call-return nodes
        auto *callReturnNode = PSNodeCallRet::cast(callNode->getPairedNode());
        assert(callReturnNode && callNode != callReturnNode);
        (void) callReturnNode; // c++17 TODO: replace with [[maybe_unused]]

        if (callNode->successorsNum() != 0) {
            assert(callNode->getSingleSuccessor() == callReturnNode);
            callNode->removeSingleSuccessor();
        } else {
            // the call does not return
            assert(callNode->successorsNum() == 0);
        }
    }
}